

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::MockCodeGenerator::MockCodeGenerator
          (MockCodeGenerator *this,string_view name)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  int iVar1;
  size_t __n;
  char *__s1;
  size_type __rlen;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  string_view sVar2;
  allocator_type local_41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  FieldDescriptor *local_38;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__MockCodeGenerator_01956f48;
  local_40 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->name_,name._M_str,name._M_str + name._M_len);
  this->suppressed_features_ = 0;
  this->minimum_edition_ = EDITION_PROTO2;
  this->maximum_edition_ = EDITION_2023;
  local_38 = GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                       ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                         *)&pb::test);
  this_00 = &this->feature_extensions_;
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(this_00,__l,&local_41);
  sVar2 = compiler::anon_unknown_0::GetTestCase();
  __s1 = sVar2._M_str;
  __n = sVar2._M_len;
  switch(__n - 0xb) {
  case 0:
    iVar1 = bcmp(__s1,"no_editions",__n);
    if (iVar1 == 0) {
      *(byte *)&this->suppressed_features_ = (byte)this->suppressed_features_ | 2;
      return;
    }
    switch(__n - 0xb) {
    case 0:
      goto switchD_00c39fb9_caseD_0;
    case 1:
      goto switchD_00c39f85_caseD_1;
    default:
      goto switchD_00c39f85_caseD_2;
    case 5:
      goto switchD_00c39f85_caseD_5;
    case 8:
      goto switchD_00c39f85_caseD_8;
    }
  case 1:
    goto switchD_00c39f85_caseD_1;
  default:
    goto switchD_00c39f85_caseD_2;
  case 5:
switchD_00c39f85_caseD_5:
    iVar1 = bcmp(__s1,"invalid_features",__n);
    if (iVar1 == 0) {
      local_38 = (FieldDescriptor *)0x0;
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)this_00,&local_38);
      return;
    }
    if (__n == 0xb) goto switchD_00c39fb9_caseD_0;
    if (__n != 0xc) {
      if (__n != 0x13) {
        return;
      }
      goto switchD_00c39f85_caseD_8;
    }
switchD_00c39f85_caseD_1:
    iVar1 = bcmp(__s1,"high_maximum",__n);
    if (iVar1 == 0) {
      this->maximum_edition_ = EDITION_99997_TEST_ONLY;
    }
    else if (__n == 0xb) {
switchD_00c39fb9_caseD_0:
      iVar1 = bcmp(__s1,"low_minimum",__n);
      if (iVar1 == 0) {
        this->maximum_edition_ = EDITION_1_TEST_ONLY;
      }
    }
switchD_00c39f85_caseD_2:
    return;
  case 8:
switchD_00c39f85_caseD_8:
    iVar1 = bcmp(__s1,"no_feature_defaults",__n);
    if (iVar1 == 0) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)this_00,0,0);
      return;
    }
    if (__n != 0xb) {
      if (__n != 0xc) {
        return;
      }
      goto switchD_00c39f85_caseD_1;
    }
    goto switchD_00c39fb9_caseD_0;
  }
}

Assistant:

MockCodeGenerator::MockCodeGenerator(absl::string_view name) : name_(name) {
  absl::string_view key = GetTestCase();
  if (key == "no_editions") {
    suppressed_features_ |= CodeGenerator::FEATURE_SUPPORTS_EDITIONS;
  } else if (key == "invalid_features") {
    feature_extensions_ = {nullptr};
  } else if (key == "no_feature_defaults") {
    feature_extensions_ = {};
  } else if (key == "high_maximum") {
    maximum_edition_ = Edition::EDITION_99997_TEST_ONLY;
  } else if (key == "low_minimum") {
    maximum_edition_ = Edition::EDITION_1_TEST_ONLY;
  }
}